

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,2,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined8 *puVar1;
  bool *pbVar2;
  _Rb_tree_node_base *p_Var3;
  Matrix<float,_2,_2> *pMVar4;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar5;
  pointer pcVar6;
  double dVar7;
  undefined8 uVar8;
  PrecisionCase *pPVar9;
  ContextType type;
  int iVar10;
  _Rb_tree_node_base *p_Var11;
  char *pcVar12;
  size_t sVar13;
  long *plVar14;
  ShaderExecutor *pSVar15;
  Interval *pIVar16;
  IVal *pIVar17;
  MessageBuilder *pMVar18;
  TestError *this_00;
  uint uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  undefined1 *puVar21;
  long lVar22;
  size_t size;
  ulong uVar23;
  long lVar24;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
  *pVVar25;
  bool bVar26;
  bool bVar27;
  IVal in2;
  IVal in3;
  IVal in1;
  ostringstream os;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
  outputs;
  Environment env;
  ShaderSpec spec;
  FloatFormat highpFmt;
  FuncSet funcs;
  ostringstream oss;
  PrecisionCase *local_588;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
  *local_580;
  Matrix<float,_2,_2> *local_578;
  string local_570;
  Statement *local_550;
  ulong local_548;
  string local_540;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_520;
  IVal *local_518;
  long local_510;
  IVal local_508;
  undefined1 local_4a8 [8];
  pointer pVStack_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  double local_488;
  Data local_480;
  undefined4 local_470;
  ios_base local_438 [8];
  ios_base local_430 [272];
  size_t local_320;
  ulong local_318;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
  local_310;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2e0;
  undefined1 local_2b0 [56];
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  FloatFormat local_238;
  undefined1 local_208 [16];
  _Base_ptr local_1f8;
  _Rb_tree_node_base *local_1f0;
  _Rb_tree_node_base *local_1e8;
  double local_1e0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_578 = (inputs->in0).
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pMVar4 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  size = (long)pMVar4 - (long)local_578 >> 4;
  local_580 = variables;
  local_550 = stmt;
  local_520 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
  ::Outputs(&local_310,size);
  local_278._M_p = (pointer)&local_268;
  local_2b0._0_4_ = GLSL_VERSION_300_ES;
  local_2b0._8_8_ = (pointer)0x0;
  local_2b0._16_8_ = (pointer)0x0;
  local_2b0._24_8_ = (pointer)0x0;
  local_2b0._32_8_ = (pointer)0x0;
  local_2b0._40_8_ = (pointer)0x0;
  local_2b0._48_8_ = (pointer)0x0;
  local_270 = 0;
  local_268._M_local_buf[0] = '\0';
  local_258._M_p = (pointer)&local_248;
  local_250 = 0;
  local_248._M_local_buf[0] = '\0';
  local_238.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_238.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_238.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_238.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_238.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_238.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_238.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_238.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_238._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e0._M_impl.super__Rb_tree_header._M_header;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4a8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"Statement: ",0xb);
  (*local_550->_vptr_Statement[2])(local_550,(ostringstream *)&pVStack_4a0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4a0);
  std::ios_base::~ios_base(local_430);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var3 = (_Rb_tree_node_base *)(local_208 + 8);
  local_208._8_4_ = _S_red;
  local_1f8 = (_Base_ptr)0x0;
  local_1e0 = 0.0;
  local_588 = this;
  local_1f0 = p_Var3;
  local_1e8 = p_Var3;
  (*local_550->_vptr_Statement[4])(local_550,local_208);
  if (local_1f0 != p_Var3) {
    p_Var11 = local_1f0;
    do {
      (**(code **)(**(long **)(p_Var11 + 1) + 0x30))(*(long **)(p_Var11 + 1),local_1a8);
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != p_Var3);
  }
  if (local_1e0 != 0.0) {
    local_4a8 = (undefined1  [8])((local_588->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4a0,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4a0,(char *)local_518,local_510);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_518 != &local_508) {
      operator_delete(local_518,local_508.m_data.m_data[0].m_data[0]._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4a0);
    std::ios_base::~ios_base(local_430);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"precision ",10);
  pcVar12 = glu::getPrecisionName((local_588->m_ctx).precision);
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)((long)&local_588 + *(long *)((long)local_4a8 + -0x18)) + 0xe0);
  }
  else {
    sVar13 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,pcVar12,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_278,(string *)local_1a8);
  pcVar6 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
  std::ios_base::~ios_base(local_438);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_588->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar25 = local_580;
  local_2b0._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_588->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_588->m_extension);
    plVar14 = (long *)std::__cxx11::string::append(local_1a8);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar20) {
      local_498._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_498._8_8_ = plVar14[3];
      local_4a8 = (undefined1  [8])&local_498;
    }
    else {
      local_498._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_4a8 = (undefined1  [8])*plVar14;
    }
    pVStack_4a0 = (pointer)plVar14[1];
    *plVar14 = (long)paVar20;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_278,(string *)local_4a8);
    if (local_4a8 != (undefined1  [8])&local_498) {
      operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
    }
    pVVar25 = local_580;
    if ((pointer)local_1a8._0_8_ != pcVar6) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2b0 + 8),1);
  makeSymbol<tcu::Matrix<float,2,2>>
            ((Symbol *)local_4a8,local_588,
             (pVVar25->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr);
  uVar8 = local_2b0._8_8_;
  std::__cxx11::string::operator=((string *)local_2b0._8_8_,(string *)local_4a8);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),(VarType *)&local_488);
  glu::VarType::~VarType((VarType *)&local_488);
  if (local_4a8 != (undefined1  [8])&local_498) {
    operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2b0 + 0x20),2);
  makeSymbol<tcu::Matrix<float,2,2>>
            ((Symbol *)local_4a8,local_588,
             (local_580->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr);
  uVar8 = local_2b0._32_8_;
  std::__cxx11::string::operator=((string *)(local_2b0._32_8_ + 0x38),(string *)local_4a8);
  glu::VarType::operator=(&((pointer)(uVar8 + 0x38))->varType,(VarType *)&local_488);
  glu::VarType::~VarType((VarType *)&local_488);
  pVVar25 = local_580;
  if (local_4a8 != (undefined1  [8])&local_498) {
    operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,2,2>>
            ((Symbol *)local_4a8,local_588,
             (pVVar25->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr);
  uVar8 = local_2b0._32_8_;
  std::__cxx11::string::operator=((string *)local_2b0._32_8_,(string *)local_4a8);
  glu::VarType::operator=((VarType *)(uVar8 + 0x20),(VarType *)&local_488);
  glu::VarType::~VarType((VarType *)&local_488);
  if (local_4a8 != (undefined1  [8])&local_498) {
    operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
  (*local_550->_vptr_Statement[2])(local_550,local_4a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
  std::ios_base::~ios_base(local_438);
  std::__cxx11::string::operator=((string *)&local_258,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar6) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar9 = local_588;
  pSVar15 = ShaderExecUtil::createExecutor
                      ((local_588->m_ctx).renderContext,(local_588->m_ctx).shaderType,
                       (ShaderSpec *)local_2b0);
  local_4a8 = (undefined1  [8])
              (local_520->in0).
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_4a0 = (local_520->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_498._M_allocated_capacity =
       (size_type)
       (local_520->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_498._8_8_ =
       (local_520->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_310.out0.
       super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_310.out1.
       super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (*pSVar15->_vptr_ShaderExecutor[3])
            (pSVar15,((pPVar9->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar10 = (*pSVar15->_vptr_ShaderExecutor[2])(pSVar15);
  if ((char)iVar10 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar15->_vptr_ShaderExecutor[5])(pSVar15);
  (*pSVar15->_vptr_ShaderExecutor[6])(pSVar15,size & 0xffffffff,local_4a8,local_1a8);
  (*pSVar15->_vptr_ShaderExecutor[1])(pSVar15);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_4a8);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
  pVVar25 = local_580;
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_208);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_2e0,
             (pVVar25->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr,(IVal *)local_4a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e0,
             (pVVar25->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_518);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e0,
             (pVVar25->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_570);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2e0,
             (pVVar25->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_540);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_2e0,
             (pVVar25->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_2e0,
             (pVVar25->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr,(IVal *)local_208);
  local_320 = size;
  if (pMVar4 == local_578) {
    local_548 = 0;
  }
  else {
    local_508.m_data.m_data[1].m_data[1].m_hi = (double)&(local_588->m_ctx).floatFormat;
    local_508.m_data.m_data[1].m_data[1].m_lo = (double)&local_588->m_status;
    local_318 = size + (size == 0);
    uVar23 = 0;
    local_548 = 0;
    do {
      tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
      tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_208);
      if ((uVar23 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_588->super_TestCase).super_TestNode.m_testCtx);
      }
      dVar7 = local_508.m_data.m_data[1].m_data[1].m_hi;
      local_578 = (Matrix<float,_2,_2> *)(uVar23 * 0x10);
      round<tcu::Matrix<float,2,2>>
                ((IVal *)&local_518,
                 (BuiltinPrecisionTests *)local_508.m_data.m_data[1].m_data[1].m_hi,
                 (FloatFormat *)
                 ((long)(local_578->m_data).m_data[0].m_data +
                 (long)(local_520->in0).
                       super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start),local_578);
      pVVar25 = local_580;
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_4a8,(FloatFormat *)dVar7,(IVal *)&local_518);
      pIVar16 = (Interval *)
                Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_2e0,
                           (pVVar25->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      pMVar18 = (MessageBuilder *)local_4a8;
      lVar22 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)((long)&pIVar16->m_hi + lVar24) =
               *(undefined8 *)
                (&(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar24);
          puVar1 = (undefined8 *)((long)&pMVar18->m_log + lVar24);
          dVar7 = (double)puVar1[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&pIVar16->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar24;
          *(undefined8 *)pbVar2 = *puVar1;
          *(double *)(pbVar2 + 8) = dVar7;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 == 0x30);
        pIVar16 = pIVar16 + 1;
        pMVar18 = (MessageBuilder *)
                  &(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        bVar26 = lVar22 == 0;
        lVar22 = lVar22 + 1;
      } while (bVar26);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e0,
                 (pVVar25->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e0,
                 (pVVar25->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2e0,
                 (pVVar25->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_480.basic.type = (local_588->m_ctx).precision;
      local_488 = *(double *)((long)local_508.m_data.m_data[1].m_data[1].m_hi + 0x20);
      local_4a8 = *(undefined1 (*) [8])local_508.m_data.m_data[1].m_data[1].m_hi;
      pVStack_4a0 = *(pointer *)((long)local_508.m_data.m_data[1].m_data[1].m_hi + 8);
      local_498._M_allocated_capacity =
           *(undefined8 *)((long)local_508.m_data.m_data[1].m_data[1].m_hi + 0x10);
      local_498._8_8_ = *(undefined8 *)((long)local_508.m_data.m_data[1].m_data[1].m_hi + 0x18);
      local_470 = 0;
      local_480._8_8_ = &local_2e0;
      (*local_550->_vptr_Statement[3])(local_550,(MessageBuilder *)local_4a8);
      pIVar17 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_2e0,
                           (pVVar25->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_4a8,&local_238,pIVar17);
      puVar21 = local_208;
      pMVar18 = (MessageBuilder *)local_4a8;
      lVar22 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)(puVar21 + lVar24 + 0x10) =
               *(undefined8 *)
                (&(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar24);
          puVar1 = (undefined8 *)((long)&pMVar18->m_log + lVar24);
          uVar8 = puVar1[1];
          *(undefined8 *)(puVar21 + lVar24) = *puVar1;
          *(undefined8 *)((long)(puVar21 + lVar24) + 8) = uVar8;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 == 0x30);
        puVar21 = puVar21 + 0x18;
        pMVar18 = (MessageBuilder *)
                  &(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        bVar26 = lVar22 == 0;
        lVar22 = lVar22 + 1;
      } while (bVar26);
      bVar26 = contains<tcu::Matrix<float,2,2>>
                         ((IVal *)local_208,
                          (Matrix<float,_2,_2> *)
                          ((long)(local_578->m_data).m_data[0].m_data +
                          (long)((local_310.out1.
                                  super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                                m_data));
      local_4a8 = (undefined1  [8])&local_498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 1 is outside acceptable range","");
      bVar26 = tcu::ResultCollector::check
                         ((ResultCollector *)local_508.m_data.m_data[1].m_data[1].m_lo,bVar26,
                          (string *)local_4a8);
      if (local_4a8 != (undefined1  [8])&local_498) {
        operator_delete((void *)local_4a8,(ulong)(local_498._M_allocated_capacity + 1));
      }
      pIVar17 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_2e0,
                           (local_580->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_4a8,&local_238,pIVar17);
      puVar21 = local_1a8;
      pMVar18 = (MessageBuilder *)local_4a8;
      lVar22 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)(puVar21 + lVar24 + 0x10) =
               *(undefined8 *)
                (&(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar24);
          puVar1 = (undefined8 *)((long)&pMVar18->m_log + lVar24);
          uVar8 = puVar1[1];
          *(undefined8 *)(puVar21 + lVar24) = *puVar1;
          *(undefined8 *)((long)(puVar21 + lVar24) + 8) = uVar8;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 == 0x30);
        puVar21 = puVar21 + 0x18;
        pMVar18 = (MessageBuilder *)
                  &(pMVar18->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        bVar27 = lVar22 == 0;
        lVar22 = lVar22 + 1;
      } while (bVar27);
      bVar27 = contains<tcu::Matrix<float,2,2>>
                         ((IVal *)local_1a8,
                          (Matrix<float,_2,_2> *)
                          ((long)(local_578->m_data).m_data[0].m_data +
                          (long)((local_310.out0.
                                  super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                                m_data));
      local_4a8 = (undefined1  [8])&local_498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 0 is outside acceptable range","");
      bVar27 = tcu::ResultCollector::check
                         ((ResultCollector *)local_508.m_data.m_data[1].m_data[1].m_lo,bVar27,
                          (string *)local_4a8);
      if (local_4a8 != (undefined1  [8])&local_498) {
        operator_delete((void *)local_4a8,(ulong)(local_498._M_allocated_capacity + 1));
      }
      uVar19 = (int)local_548 + ((byte)~(bVar26 && bVar27) & 1);
      local_548 = (ulong)uVar19;
      if ((int)uVar19 < 0x65 && (!bVar26 || !bVar27)) {
        local_4a8 = (undefined1  [8])((local_588->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
        pcVar12 = "Failed";
        if (bVar26 && bVar27) {
          pcVar12 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,pcVar12,6);
        pVVar25 = local_580;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\t",1);
        pVVar5 = (pVVar25->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                 .m_ptr;
        pIVar17 = &local_508;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_518 = pIVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_518,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4a0,(char *)local_518,local_510);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_570,(BuiltinPrecisionTests *)&local_238,
                   (FloatFormat *)
                   ((long)(local_578->m_data).m_data[0].m_data +
                   (long)(local_520->in0).
                         super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start),(Matrix<float,_2,_2> *)pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4a0,local_570._M_dataplus._M_p,local_570._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
        }
        if (local_518 != &local_508) {
          operator_delete(local_518,local_508.m_data.m_data[0].m_data[0]._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\t",1);
        pVVar5 = (pVVar25->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                 .m_ptr;
        pIVar17 = &local_508;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_518 = pIVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_518,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4a0,(char *)local_518,local_510);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_570,(BuiltinPrecisionTests *)&local_238,
                   (FloatFormat *)
                   ((long)(local_578->m_data).m_data[0].m_data +
                   (long)((local_310.out0.
                           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data),
                   (Matrix<float,_2,_2> *)pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4a0,local_570._M_dataplus._M_p,local_570._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4a0,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_540,(BuiltinPrecisionTests *)&local_238,(FloatFormat *)local_1a8,pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4a0,local_540._M_dataplus._M_p,local_540._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._M_dataplus._M_p != &local_540.field_2) {
          operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
        }
        if (local_518 != &local_508) {
          operator_delete(local_518,local_508.m_data.m_data[0].m_data[0]._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\t",1);
        pVVar5 = (pVVar25->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                 .m_ptr;
        pIVar17 = &local_508;
        pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
        local_518 = pIVar17;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_518,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4a0,(char *)local_518,local_510);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_570,(BuiltinPrecisionTests *)&local_238,
                   (FloatFormat *)
                   ((long)((local_310.out1.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   (long)(local_578->m_data).m_data[0].m_data),(Matrix<float,_2,_2> *)pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4a0,local_570._M_dataplus._M_p,local_570._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4a0,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_540,(BuiltinPrecisionTests *)&local_238,(FloatFormat *)local_208,pIVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_4a0,local_540._M_dataplus._M_p,local_540._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._M_dataplus._M_p != &local_540.field_2) {
          operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
        }
        if (local_518 != &local_508) {
          operator_delete(local_518,local_508.m_data.m_data[0].m_data[0]._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4a0);
        std::ios_base::~ios_base(local_430);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != local_318);
  }
  iVar10 = (int)local_548;
  if (100 < iVar10) {
    local_4a8 = (undefined1  [8])((local_588->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"(Skipped ",9);
    std::ostream::operator<<((ostringstream *)&pVStack_4a0,iVar10 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4a0);
    std::ios_base::~ios_base(local_430);
  }
  if (iVar10 == 0) {
    local_4a8 = (undefined1  [8])((local_588->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4a0," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4a8 = (undefined1  [8])((local_588->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
    std::ostream::operator<<((ostringstream *)&pVStack_4a0,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4a0," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4a0);
  std::ios_base::~ios_base(local_430);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_p != &local_248) {
    operator_delete(local_258._M_p,
                    CONCAT71(local_248._M_allocated_capacity._1_7_,local_248._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_p != &local_268) {
    operator_delete(local_278._M_p,
                    CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2b0 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2b0 + 8));
  if (local_310.out1.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.out1.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_310.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_310.out0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_310.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}